

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CS248::Viewer::update(void)

{
  allocator local_29;
  string local_28;
  
  glClear(0x4100);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x18))();
  }
  std::__cxx11::string::string((string *)&local_28,"post render",&local_29);
  checkGLError(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (showInfo == '\x01') {
    drawInfo();
  }
  std::__cxx11::string::string((string *)&local_28,"post drawInfo",&local_29);
  checkGLError(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  drawError();
  std::__cxx11::string::string((string *)&local_28,"post drawError",&local_29);
  checkGLError(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glfwSwapBuffers(window);
  glfwPollEvents();
  std::__cxx11::string::string((string *)&local_28,"end of Viewer::update",&local_29);
  checkGLError(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Viewer::update() {

  // clear frame
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  // run user renderer
  if (renderer) {
    renderer->render();
  }

  checkGLError("post render");

  // FIXME(kayvonf): commented out for now since it was throwing GL errors

  // draw info
  if (showInfo) {
   drawInfo();
  }

  checkGLError("post drawInfo");

  drawError();

  checkGLError("post drawError");

  // swap buffers
  glfwSwapBuffers(window); 

  // poll events
  glfwPollEvents();

  checkGLError("end of Viewer::update");

}